

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O3

Id dxil_spv::build_physical_pointer_address_for_raw_load_store(Impl *impl,CallInst *instruction)

{
  uint value;
  Id u32x2_value;
  Id IVar1;
  Id arg;
  Id type_id;
  Builder *this;
  Value *pVVar2;
  mapped_type *pmVar3;
  Operation *this_00;
  Operation *this_01;
  Id ptr_id;
  key_type local_34;
  
  this = Converter::Impl::builder(impl);
  pVVar2 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  u32x2_value = Converter::Impl::get_id_for_value(impl,pVVar2,0);
  pmVar3 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&impl->handle_to_resource_meta,&local_34);
  pVVar2 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2);
  IVar1 = Converter::Impl::get_id_for_value(impl,pVVar2,0);
  if (pmVar3->stride != 0) {
    pVVar2 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,3);
    arg = Converter::Impl::get_id_for_value(impl,pVVar2,0);
    if (pmVar3->stride != 0) {
      type_id = spv::Builder::makeIntegerType(this,0x20,false);
      this_00 = Converter::Impl::allocate(impl,OpIMul,type_id);
      Operation::add_id(this_00,IVar1);
      value = pmVar3->stride;
      IVar1 = spv::Builder::makeIntegerType(this,0x20,false);
      IVar1 = spv::Builder::makeIntConstant(this,IVar1,value,false);
      Operation::add_id(this_00,IVar1);
      Converter::Impl::add(impl,this_00,false);
      IVar1 = spv::Builder::makeIntegerType(this,0x20,false);
      this_01 = Converter::Impl::allocate(impl,OpIAdd,IVar1);
      Operation::add_id(this_01,this_00->id);
      Operation::add_id(this_01,arg);
      Converter::Impl::add(impl,this_01,false);
      IVar1 = this_01->id;
    }
  }
  IVar1 = emit_u32x2_u32_add(impl,u32x2_value,IVar1);
  return IVar1;
}

Assistant:

static spv::Id build_physical_pointer_address_for_raw_load_store(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	spv::Id ptr_id = impl.get_id_for_value(instruction->getOperand(1));
	const auto &meta = impl.handle_to_resource_meta[ptr_id];

	spv::Id index_id = impl.get_id_for_value(instruction->getOperand(2));
	spv::Id element_offset = 0;
	if (meta.stride != 0)
		element_offset = impl.get_id_for_value(instruction->getOperand(3));

	spv::Id byte_offset_id = 0;
	if (meta.stride)
	{
		auto *stride_op = impl.allocate(spv::OpIMul, builder.makeUintType(32));
		stride_op->add_id(index_id);
		stride_op->add_id(builder.makeUintConstant(meta.stride));
		impl.add(stride_op);

		auto *offset_op = impl.allocate(spv::OpIAdd, builder.makeUintType(32));
		offset_op->add_id(stride_op->id);
		offset_op->add_id(element_offset);
		impl.add(offset_op);

		byte_offset_id = offset_op->id;
	}
	else
	{
		byte_offset_id = index_id;
	}

	return emit_u32x2_u32_add(impl, ptr_id, byte_offset_id);
}